

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wrap.cpp
# Opt level: O0

client_socket * C_std::Network::easy_accept(client_socket *__return_storage_ptr__,int sockfd)

{
  uint16_t uVar1;
  int _sockfd;
  char *pcVar2;
  allocator local_2091;
  string local_2090 [55];
  allocator local_2059;
  string local_2058 [32];
  char local_2038 [8];
  char buf [8192];
  socklen_t local_28;
  int cfd;
  socklen_t addr_len;
  sockaddr_in addr;
  int sockfd_local;
  
  local_28 = 0x10;
  addr.sin_zero._0_4_ = sockfd;
  unique0x10000193 = __return_storage_ptr__;
  memset(&cfd,0,0x10);
  _sockfd = Accept(addr.sin_zero._0_4_,(sockaddr *)&cfd,&local_28);
  pcVar2 = inet_ntop(2,&addr_len,local_2038,0x2000);
  if (pcVar2 == (char *)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_2058,"af to ip error",&local_2059);
    perror_exit((string *)local_2058);
    std::__cxx11::string::~string(local_2058);
    std::allocator<char>::~allocator((allocator<char> *)&local_2059);
  }
  uVar1 = ntohs(cfd._2_2_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2090,local_2038,&local_2091);
  client_socket::client_socket(__return_storage_ptr__,_sockfd,(uint)uVar1,(string *)local_2090);
  std::__cxx11::string::~string(local_2090);
  std::allocator<char>::~allocator((allocator<char> *)&local_2091);
  return __return_storage_ptr__;
}

Assistant:

client_socket easy_accept(int sockfd) {
            struct sockaddr_in addr;
            socklen_t addr_len = sizeof(addr);
            memset(&addr, 0, sizeof(addr));
            int cfd = Accept(sockfd, reinterpret_cast<struct sockaddr *>(&addr), &addr_len);
            char buf[BUFSIZ];
            if (inet_ntop(AF_INET, &addr.sin_addr.s_addr, buf, BUFSIZ) == nullptr) {
                perror_exit("af to ip error");
            }
            return client_socket(cfd, ntohs(addr.sin_port), buf);
        }